

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_schnorrsig.cpp
# Opt level: O0

void __thiscall
SchnorrPubkey_TweakAdd_Test::SchnorrPubkey_TweakAdd_Test(SchnorrPubkey_TweakAdd_Test *this)

{
  SchnorrPubkey_TweakAdd_Test *this_local;
  
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__SchnorrPubkey_TweakAdd_Test_009eb750;
  return;
}

Assistant:

TEST(SchnorrPubkey, TweakAdd) {
  ByteData256 tweak1("45cfe14923541d2908a64f32aaf09b703dbd2cfb256830b0eebc5573b15a4476");
  ByteData256 tweak2("0daf700e00c25a75feb3b747a5f31ba58f4a7c3c7b36eaceef7cb882a06a9bf1");
  SchnorrPubkey tweak_pubkey1;
  SchnorrPubkey tweak_pubkey2;
  bool is_parity1 = false;
  bool is_parity2 = false;

  std::string exp_pubkey1 = "ac52f50b28cdd4d3bcb7f0d5cb533f232e4c4ef12fbf3e718420b84d4e3c3440";
  std::string exp_pubkey2 = "943203db3a9a8845a4aee1af81b76cb9ec60ab08d700df59a32426a4e6e1557b";

  EXPECT_NO_THROW(tweak_pubkey1 = pubkey.CreateTweakAdd(tweak1, &is_parity1));
  EXPECT_EQ(exp_pubkey1, tweak_pubkey1.GetHex());
  EXPECT_TRUE(is_parity1);

  EXPECT_NO_THROW(tweak_pubkey2 = pubkey.CreateTweakAdd(tweak2, &is_parity2));
  EXPECT_EQ(exp_pubkey2, tweak_pubkey2.GetHex());
  EXPECT_FALSE(is_parity2);

  EXPECT_TRUE(tweak_pubkey1.IsTweaked(pubkey, tweak1, is_parity1));
  EXPECT_TRUE(tweak_pubkey2.IsTweaked(pubkey, tweak2, is_parity2));
  EXPECT_FALSE(tweak_pubkey1.IsTweaked(pubkey, tweak2, !is_parity1));
  EXPECT_FALSE(tweak_pubkey2.IsTweaked(pubkey, tweak2, !is_parity2));

  Privkey tweak_sk1;
  Privkey tweak_sk2;
  Privkey key = sk;
  if (pubkey_parity) key = sk.CreateNegate();
  EXPECT_NO_THROW(tweak_sk1 = key.CreateTweakAdd(tweak1));
  EXPECT_NO_THROW(tweak_sk2 = key.CreateTweakAdd(tweak2));

  SchnorrPubkey tweak_pubkey21 = SchnorrPubkey::FromPrivkey(tweak_sk1);
  SchnorrPubkey tweak_pubkey22 = SchnorrPubkey::FromPrivkey(tweak_sk2);
  EXPECT_EQ(exp_pubkey1, tweak_pubkey21.GetHex());
  EXPECT_EQ(exp_pubkey2, tweak_pubkey22.GetHex());
}